

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

Optional<unsigned_int> __thiscall Catch::parseUInt(Catch *this,string *input,int base)

{
  int iVar1;
  _Alloc_hider __nptr;
  int *piVar2;
  ulonglong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  Catch *pCVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  Optional<unsigned_int> OVar7;
  undefined1 auVar8 [12];
  string trimmed;
  string local_58;
  char *local_38;
  
  trim(&local_58,input);
  __nptr._M_p = local_58._M_dataplus._M_p;
  uVar5 = extraout_RDX;
  if ((local_58._M_string_length != 0) && (*local_58._M_dataplus._M_p != '-')) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    uVar3 = strtoull(__nptr._M_p,&local_38,base);
    uVar5 = (long)local_38 - (long)__nptr._M_p;
    if (uVar5 == 0) {
      std::__throw_invalid_argument("stoull");
    }
    else if (*piVar2 != 0x22) {
      if (*piVar2 == 0) {
        *piVar2 = iVar1;
      }
      uVar5 = uVar3 >> 0x20 | uVar5 ^ local_58._M_string_length;
      if (uVar5 == 0) {
        pCVar6 = this + 8;
        *(int *)(this + 8) = (int)uVar3;
        goto LAB_00146a33;
      }
      goto LAB_00146a31;
    }
    auVar8 = std::__throw_out_of_range("stoull");
    uVar4 = auVar8._0_8_;
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (auVar8._8_4_ == 2) {
      __cxa_begin_catch(uVar4);
      __cxa_end_catch();
      uVar5 = extraout_RDX_01;
    }
    else {
      if (auVar8._8_4_ != 1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar4);
      }
      __cxa_begin_catch(uVar4);
      __cxa_end_catch();
      uVar5 = extraout_RDX_02;
    }
  }
LAB_00146a31:
  pCVar6 = (Catch *)0x0;
LAB_00146a33:
  *(Catch **)this = pCVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_RDX_00;
  }
  OVar7.storage[0] = (char)uVar5;
  OVar7.storage[1] = (char)(uVar5 >> 8);
  OVar7.storage[2] = (char)(uVar5 >> 0x10);
  OVar7.storage[3] = (char)(uVar5 >> 0x18);
  OVar7._12_4_ = (int)(uVar5 >> 0x20);
  OVar7.nullableValue = (uint *)this;
  return OVar7;
}

Assistant:

Optional<unsigned int> parseUInt(std::string const& input, int base) {
        auto trimmed = trim( input );
        // std::stoull is annoying and accepts numbers starting with '-',
        // it just negates them into unsigned int
        if ( trimmed.empty() || trimmed[0] == '-' ) {
            return {};
        }

        CATCH_TRY {
            size_t pos = 0;
            const auto ret = std::stoull( trimmed, &pos, base );

            // We did not consume the whole input, so there is an issue
            // This can be bunch of different stuff, like multiple numbers
            // in the input, or invalid digits/characters and so on. Either
            // way, we do not want to return the partially parsed result.
            if ( pos != trimmed.size() ) {
                return {};
            }
            // Too large
            if ( ret > std::numeric_limits<unsigned int>::max() ) {
                return {};
            }
            return static_cast<unsigned int>(ret);
        }